

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclPrintBuffers(SC_Lib *pLib,Abc_Ntk_t *pNtk,int fVerbose)

{
  SC_Man *p;
  
  if ((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    p = Abc_SclManStart(pLib,pNtk,0,1,0.0,10000);
    Abc_SclPrintBufferTrees(p,pNtk);
    Abc_SclManFree(p);
    return;
  }
  __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                ,0x385,"void Abc_SclPrintBuffers(SC_Lib *, Abc_Ntk_t *, int)");
}

Assistant:

void Abc_SclPrintBuffers( SC_Lib * pLib, Abc_Ntk_t * pNtk, int fVerbose )
{
    int fUseWireLoads = 0;
    SC_Man * p;
    assert( Abc_NtkIsMappedLogic(pNtk) );
    p = Abc_SclManStart( pLib, pNtk, fUseWireLoads, 1, 0, 10000 ); 
    Abc_SclPrintBufferTrees( p, pNtk ); 
//    Abc_SclPrintFaninPairs( p, pNtk );
    Abc_SclManFree( p );
}